

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

string * __thiscall
nlohmann::detail::
parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::input_stream_adapter>
::exception_message(string *__return_storage_ptr__,
                   parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::input_stream_adapter>
                   *this,token_type expected,string *context)

{
  size_type *psVar1;
  long *plVar2;
  size_t sVar3;
  undefined8 *puVar4;
  char *pcVar5;
  long *plVar6;
  ulong *puVar7;
  char *pcVar8;
  long *plVar9;
  ulong uVar10;
  undefined8 uVar11;
  _Alloc_hider _Var12;
  long *local_d0;
  long local_c0;
  long lStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  ulong *local_90;
  long local_88;
  ulong local_80;
  long lStack_78;
  string local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"syntax error ","");
  if (context->_M_string_length != 0) {
    std::operator+(&local_b0,"while parsing ",context);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_b0);
    plVar6 = plVar2 + 2;
    if ((long *)*plVar2 == plVar6) {
      local_c0 = *plVar6;
      lStack_b8 = plVar2[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *plVar6;
      local_d0 = (long *)*plVar2;
    }
    *plVar2 = (long)plVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_d0);
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (this->last_token == parse_error) {
    pcVar5 = (this->m_lexer).error_message;
    local_50[0] = &local_40;
    if (pcVar5 == (char *)0x0) {
      pcVar8 = (char *)0x1;
    }
    else {
      sVar3 = strlen(pcVar5);
      pcVar8 = pcVar5 + sVar3;
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pcVar5,pcVar8);
    plVar2 = (long *)std::__cxx11::string::append((char *)local_50);
    puVar7 = (ulong *)(plVar2 + 2);
    if ((ulong *)*plVar2 == puVar7) {
      local_80 = *puVar7;
      lStack_78 = plVar2[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *puVar7;
      local_90 = (ulong *)*plVar2;
    }
    local_88 = plVar2[1];
    *plVar2 = (long)puVar7;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::input_stream_adapter>
    ::get_token_string(&local_70,&this->m_lexer);
    uVar10 = 0xf;
    if (local_90 != &local_80) {
      uVar10 = local_80;
    }
    if (uVar10 < local_70._M_string_length + local_88) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        uVar11 = local_70.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_70._M_string_length + local_88) goto LAB_0011e3fb;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_90);
    }
    else {
LAB_0011e3fb:
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_70._M_dataplus._M_p);
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    psVar1 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar1) {
      local_b0.field_2._M_allocated_capacity = *psVar1;
      local_b0.field_2._8_8_ = puVar4[3];
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar1;
      local_b0._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_b0._M_string_length = puVar4[1];
    *puVar4 = psVar1;
    puVar4[1] = 0;
    *(undefined1 *)psVar1 = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_b0);
    plVar6 = plVar2 + 2;
    if ((long *)*plVar2 == plVar6) {
      local_c0 = *plVar6;
      lStack_b8 = plVar2[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *plVar6;
      local_d0 = (long *)*plVar2;
    }
    *plVar2 = (long)plVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_d0);
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    _Var12._M_p = (pointer)local_50[0];
    if (local_50[0] == &local_40) goto LAB_0011e546;
  }
  else {
    pcVar5 = lexer_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::token_type_name(this->last_token);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    sVar3 = strlen(pcVar5);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,pcVar5,pcVar5 + sVar3);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x136935);
    plVar6 = plVar2 + 2;
    if ((long *)*plVar2 == plVar6) {
      local_c0 = *plVar6;
      lStack_b8 = plVar2[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *plVar6;
      local_d0 = (long *)*plVar2;
    }
    *plVar2 = (long)plVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_d0);
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    local_40._M_allocated_capacity = local_b0.field_2._M_allocated_capacity;
    _Var12._M_p = local_b0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == &local_b0.field_2) goto LAB_0011e546;
  }
  operator_delete(_Var12._M_p,local_40._M_allocated_capacity + 1);
LAB_0011e546:
  if (expected != uninitialized) {
    pcVar5 = lexer_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::token_type_name(expected);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    sVar3 = strlen(pcVar5);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,pcVar5,pcVar5 + sVar3);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x136941);
    plVar6 = plVar2 + 2;
    if ((long *)*plVar2 == plVar6) {
      local_c0 = *plVar6;
      lStack_b8 = plVar2[3];
      plVar9 = &local_c0;
    }
    else {
      local_c0 = *plVar6;
      plVar9 = (long *)*plVar2;
    }
    *plVar2 = (long)plVar6;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)plVar9);
    if (plVar9 != &local_c0) {
      operator_delete(plVar9,local_c0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string exception_message(const token_type expected, const std::string& context)
{
std::string error_msg = "syntax error ";

if (!context.empty())
{
error_msg += "while parsing " + context + " ";
}

error_msg += "- ";

if (last_token == token_type::parse_error)
{
error_msg += std::string(m_lexer.get_error_message()) + "; last read: '" +
m_lexer.get_token_string() + "'";
}
else
{
error_msg += "unexpected " + std::string(lexer_t::token_type_name(last_token));
}

if (expected != token_type::uninitialized)
{
error_msg += "; expected " + std::string(lexer_t::token_type_name(expected));
}

return error_msg;
}